

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualMulti.cpp
# Opt level: O3

void __thiscall HEkkDual::minorUpdate(HEkkDual *this)

{
  double *pdVar1;
  HEkk *pHVar2;
  pointer piVar3;
  iterator __position;
  undefined1 auVar4 [16];
  int iVar5;
  int *__args;
  long lVar6;
  long lVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  iVar5 = this->multi_nFinish;
  pHVar2 = this->ekk_instance_;
  this->multi_finish[iVar5].move_in =
       (pHVar2->basis_).nonbasicMove_.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
       _M_impl.super__Vector_impl_data._M_start[this->variable_in];
  this->multi_finish[iVar5].shiftOut =
       (pHVar2->info_).workShift_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start[this->variable_out];
  piVar3 = this->multi_finish[iVar5].flipList.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (this->multi_finish[iVar5].flipList.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar3) {
    this->multi_finish[iVar5].flipList.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar3;
  }
  if (0 < (this->dualRow).workCount) {
    lVar6 = 0;
    lVar7 = 0;
    do {
      __args = (int *)((long)&((this->dualRow).workData.
                               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->first + lVar6);
      __position._M_current =
           this->multi_finish[iVar5].flipList.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          this->multi_finish[iVar5].flipList.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->multi_finish[iVar5].flipList,__position
                   ,__args);
      }
      else {
        *__position._M_current = *__args;
        this->multi_finish[iVar5].flipList.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 0x10;
    } while (lVar7 < (this->dualRow).workCount);
  }
  minorUpdateDual(this);
  minorUpdatePrimal(this);
  minorUpdatePivots(this);
  minorUpdateRows(this);
  auVar4 = _DAT_003beea0;
  if (this->minor_new_devex_framework != false) {
    iVar5 = this->multi_num;
    if (0 < (long)iVar5) {
      lVar6 = (long)iVar5 + -1;
      auVar9._8_4_ = (int)lVar6;
      auVar9._0_8_ = lVar6;
      auVar9._12_4_ = (int)((ulong)lVar6 >> 0x20);
      lVar6 = 0;
      auVar9 = auVar9 ^ _DAT_003beea0;
      auVar10 = _DAT_003bee90;
      do {
        auVar11 = auVar10 ^ auVar4;
        if ((bool)(~(auVar11._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar11._0_4_ ||
                    auVar9._4_4_ < auVar11._4_4_) & 1)) {
          *(undefined8 *)((long)&this->multi_choice[0].infeasEdWt + lVar6) = 0x3ff0000000000000;
        }
        if ((auVar11._12_4_ != auVar9._12_4_ || auVar11._8_4_ <= auVar9._8_4_) &&
            auVar11._12_4_ <= auVar9._12_4_) {
          *(undefined8 *)((long)&this->multi_choice[1].infeasEdWt + lVar6) = 0x3ff0000000000000;
        }
        lVar7 = auVar10._8_8_;
        auVar10._0_8_ = auVar10._0_8_ + 2;
        auVar10._8_8_ = lVar7 + 2;
        lVar6 = lVar6 + 0x490;
      } while ((ulong)(iVar5 + 1U >> 1) * 0x490 - lVar6 != 0);
    }
    this->minor_new_devex_framework = false;
  }
  this->multi_nFinish = this->multi_nFinish + 1;
  iterationAnalysisMinor(this);
  if (0 < (long)this->multi_num) {
    lVar6 = 0;
    iVar5 = 0;
    do {
      if (-1 < *(int *)((long)&this->multi_choice[0].row_out + lVar6)) {
        dVar8 = *(double *)((long)&this->multi_choice[0].infeasValue + lVar6) /
                *(double *)((long)&this->multi_choice[0].infeasEdWt + lVar6);
        pdVar1 = (double *)((long)&this->multi_choice[0].infeasLimit + lVar6);
        iVar5 = iVar5 + (uint)(*pdVar1 <= dVar8 && dVar8 != *pdVar1);
      }
      lVar6 = lVar6 + 0x248;
    } while ((long)this->multi_num * 0x248 - lVar6 != 0);
    if (iVar5 != 0) {
      return;
    }
  }
  this->multi_chooseAgain = 1;
  return;
}

Assistant:

void HEkkDual::minorUpdate() {
  // Minor update - store roll back data
  MFinish* finish = &multi_finish[multi_nFinish];
  finish->move_in = ekk_instance_.basis_.nonbasicMove_[variable_in];
  finish->shiftOut = ekk_instance_.info_.workShift_[variable_out];
  finish->flipList.clear();
  for (HighsInt i = 0; i < dualRow.workCount; i++)
    finish->flipList.push_back(dualRow.workData[i].first);

  // Minor update - key parts
  minorUpdateDual();
  minorUpdatePrimal();
  minorUpdatePivots();
  minorUpdateRows();
  if (minor_new_devex_framework) {
    /*
    printf("Iter %7" HIGHSINT_FORMAT " (Major %7" HIGHSINT_FORMAT "): Minor new
    Devex framework\n", ekk_instance_.iteration_count_,
           multi_iteration);
    */
    minorInitialiseDevexFramework();
  }
  multi_nFinish++;
  // Analyse the iteration: possibly report; possibly switch strategy
  iterationAnalysisMinor();

  // Minor update - check for the next iteration
  HighsInt countRemain = 0;
  for (HighsInt i = 0; i < multi_num; i++) {
    HighsInt iRow = multi_choice[i].row_out;
    if (iRow < 0) continue;
    double myInfeas = multi_choice[i].infeasValue;
    double myWeight = multi_choice[i].infeasEdWt;
    countRemain += (myInfeas / myWeight > multi_choice[i].infeasLimit);
  }
  if (countRemain == 0) multi_chooseAgain = 1;
}